

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O2

void __thiscall
Parser_emptyImportWithAndWithoutId_Test::TestBody(Parser_emptyImportWithAndWithoutId_Test *this)

{
  long lVar1;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  ScopedTrace gtest_trace_1237;
  allocator_type local_f2;
  allocator<char> local_f1;
  allocator<char> local_f0 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_e8;
  ModelPtr m;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  e;
  string in;
  ParserPtr parser;
  string local_78 [32];
  string local_58 [32];
  string local_38 [32];
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&in,
             "<?xml version=\"1.0\" encoding=\"UTF-8\"?>\n<model xmlns=\"http://www.cellml.org/cellml/2.0#\" name=\"model_name\">\n  <import/>  <import id = \"import_id\" />\n</model>\n"
             ,(allocator<char> *)&parser);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&parser,"Import does not specify an xlink:href attribute.",
             (allocator<char> *)&m);
  std::__cxx11::string::string<std::allocator<char>>
            (local_78,"Import from \'\' is empty and will be disregarded.",local_f0);
  std::__cxx11::string::string<std::allocator<char>>
            (local_58,"Import does not specify an xlink:href attribute.",
             (allocator<char> *)&gtest_trace_1237);
  std::__cxx11::string::string<std::allocator<char>>
            (local_38,
             "Import from \'\' has an identifier of \'import_id\' but is empty. The import will be disregarded and the associated identifier will be lost."
             ,&local_f1);
  __l._M_len = 4;
  __l._M_array = (iterator)&parser;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&e,__l,&local_f2);
  lVar1 = 0x60;
  do {
    std::__cxx11::string::~string
              ((string *)
               ((long)&parser.super___shared_ptr<libcellml::Parser,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr + lVar1));
    lVar1 = lVar1 + -0x20;
  } while (lVar1 != -0x20);
  libcellml::Parser::create(SUB81(&parser,0));
  libcellml::Parser::parseModel((string *)&m);
  testing::ScopedTrace::ScopedTrace
            (&gtest_trace_1237,
             "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/parser/parser.cpp"
             ,0x4d5,"Issue occurred here.");
  std::__shared_ptr<libcellml::Logger,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<libcellml::Parser,void>
            ((__shared_ptr<libcellml::Logger,(__gnu_cxx::_Lock_policy)2> *)local_f0,
             &parser.super___shared_ptr<libcellml::Parser,_(__gnu_cxx::_Lock_policy)2>);
  expectEqualIssues((vector *)&e,(shared_ptr *)local_f0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_e8);
  testing::ScopedTrace::~ScopedTrace(&gtest_trace_1237);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&m.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&parser.super___shared_ptr<libcellml::Parser,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&e);
  std::__cxx11::string::~string((string *)&in);
  return;
}

Assistant:

TEST(Parser, emptyImportWithAndWithoutId)
{
    const std::string in =
        "<?xml version=\"1.0\" encoding=\"UTF-8\"?>\n"
        "<model xmlns=\"http://www.cellml.org/cellml/2.0#\" name=\"model_name\">\n"
        "  <import/>"
        "  <import id = \"import_id\" />\n"
        "</model>\n";
    std::vector<std::string> e = {
        "Import does not specify an xlink:href attribute.",
        "Import from '' is empty and will be disregarded.",
        "Import does not specify an xlink:href attribute.",
        "Import from '' has an identifier of 'import_id' but is empty. The import will be disregarded and the associated identifier will be lost.",
    };
    libcellml::ParserPtr parser = libcellml::Parser::create();
    auto m = parser->parseModel(in);
    EXPECT_EQ_ISSUES(e, parser);
}